

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ReporterRegistry::~ReporterRegistry(ReporterRegistry *this)

{
  ReporterRegistry *this_local;
  
  (this->super_IReporterRegistry)._vptr_IReporterRegistry =
       (_func_int **)&PTR__ReporterRegistry_001eb278;
  deleteAllValues<std::map<std::__cxx11::string,Catch::IReporterFactory*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>>
            (&this->m_factories);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
  ::~map(&this->m_factories);
  IReporterRegistry::~IReporterRegistry(&this->super_IReporterRegistry);
  return;
}

Assistant:

virtual ~ReporterRegistry() {
            deleteAllValues( m_factories );
        }